

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void fillTensor<unsigned_int>
               (vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                *tensor,uint value)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  int j;
  long lVar7;
  int i;
  long lVar8;
  int k;
  long lVar9;
  
  pvVar1 = (tensor->
           super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (tensor->
           super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (lVar8 = 0; lVar8 != ((long)pvVar2 - (long)pvVar1) / 0x18; lVar8 = lVar8 + 1) {
    lVar3 = *(long *)&pvVar1[lVar8].
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data;
    pvVar4 = *(pointer *)
              ((long)&pvVar1[lVar8].
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    for (lVar7 = 0; lVar7 != ((long)pvVar4 - lVar3) / 0x18; lVar7 = lVar7 + 1) {
      lVar5 = *(long *)(lVar3 + lVar7 * 0x18);
      lVar6 = *(long *)(lVar3 + 8 + lVar7 * 0x18);
      for (lVar9 = 0; lVar6 - lVar5 >> 2 != lVar9; lVar9 = lVar9 + 1) {
        *(uint *)(lVar5 + lVar9 * 4) = value;
      }
    }
  }
  return;
}

Assistant:

void fillTensor(std::vector<std::vector<std::vector<T> > > &tensor, T value){
    for(int i=0; i<tensor.size(); i++){
        for(int j=0; j<tensor[i].size(); j++){
            for(int k=0; k<tensor[i][j].size(); k++){
                tensor[i][j][k] = value;
            }
        }
    }
}